

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O2

void __thiscall
deqp::gls::RandomShaderProgram::shadeVertices
          (RandomShaderProgram *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  ExecutionContext *execCtx;
  uint uVar1;
  Shader *this_00;
  pointer ppSVar2;
  Variable *pVVar3;
  VertexPacket *pVVar4;
  pointer ppVVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int ndx;
  ulong uVar11;
  long lVar12;
  int varNdx;
  StridedValueAccess<64> SVar13;
  ConstStridedValueAccess<64> CVar14;
  ExecValueAccess access;
  Vec4 attribValue;
  
  refreshUniforms(this);
  execCtx = &this->m_execCtx;
  for (iVar8 = 0; uVar10 = numPackets - iVar8, uVar10 != 0 && iVar8 <= numPackets;
      iVar8 = iVar8 + uVar10) {
    if (0x3f < (int)uVar10) {
      uVar10 = 0x40;
    }
    uVar9 = 0;
    if (0 < (int)uVar10) {
      uVar9 = (ulong)uVar10;
    }
    lVar12 = 0;
    while( true ) {
      this_00 = this->m_vertexShader;
      ppSVar2 = (this_00->m_inputs).
                super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(this_00->m_inputs).
                              super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2) >> 3) <=
          lVar12) break;
      pVVar3 = ppSVar2[lVar12]->m_variable;
      uVar1 = (pVVar3->m_type).m_numElements;
      access = rsg::ExecutionContext::getValue(execCtx,pVVar3);
      for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        rr::readVertexAttribFloat
                  ((rr *)&attribValue,inputs + lVar12,packets[iVar8 + (int)uVar11]->instanceNdx,
                   packets[iVar8 + (int)uVar11]->vertexNdx);
        fVar6 = attribValue.m_data[0];
        SVar13 = rsg::StridedValueAccess<64>::component
                           ((StridedValueAccess<64> *)&access.super_ConstStridedValueAccess<64>,0);
        fVar7 = attribValue.m_data[1];
        SVar13.super_ConstStridedValueAccess<64>.m_value[uVar11].floatVal = fVar6;
        if (1 < (int)uVar1) {
          SVar13 = rsg::StridedValueAccess<64>::component
                             ((StridedValueAccess<64> *)&access.super_ConstStridedValueAccess<64>,1)
          ;
          fVar6 = attribValue.m_data[2];
          SVar13.super_ConstStridedValueAccess<64>.m_value[uVar11].floatVal = fVar7;
          if (uVar1 != 2) {
            SVar13 = rsg::StridedValueAccess<64>::component
                               ((StridedValueAccess<64> *)&access.super_ConstStridedValueAccess<64>,
                                2);
            fVar7 = attribValue.m_data[3];
            SVar13.super_ConstStridedValueAccess<64>.m_value[uVar11].floatVal = fVar6;
            if (3 < uVar1) {
              SVar13 = rsg::StridedValueAccess<64>::component
                                 ((StridedValueAccess<64> *)
                                  &access.super_ConstStridedValueAccess<64>,3);
              SVar13.super_ConstStridedValueAccess<64>.m_value[uVar11].floatVal = fVar7;
            }
          }
        }
      }
      lVar12 = lVar12 + 1;
    }
    rsg::Shader::execute(this_00,execCtx);
    access = rsg::ExecutionContext::getValue(execCtx,this->m_positionVar);
    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      pVVar4 = packets[iVar8 + (int)uVar11];
      CVar14 = rsg::ConstStridedValueAccess<64>::component
                         (&access.super_ConstStridedValueAccess<64>,0);
      (pVVar4->position).m_data[0] = (float)CVar14.m_value[uVar11];
      CVar14 = rsg::ConstStridedValueAccess<64>::component
                         (&access.super_ConstStridedValueAccess<64>,1);
      *(Scalar *)((pVVar4->position).m_data + 1) = CVar14.m_value[uVar11];
      CVar14 = rsg::ConstStridedValueAccess<64>::component
                         (&access.super_ConstStridedValueAccess<64>,2);
      *(Scalar *)((pVVar4->position).m_data + 2) = CVar14.m_value[uVar11];
      CVar14 = rsg::ConstStridedValueAccess<64>::component
                         (&access.super_ConstStridedValueAccess<64>,3);
      *(Scalar *)((pVVar4->position).m_data + 3) = CVar14.m_value[uVar11];
    }
    for (lVar12 = 0;
        ppVVar5 = (this->m_vertexOutputs).
                  super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        lVar12 < (int)((ulong)((long)(this->m_vertexOutputs).
                                     super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar5) >>
                      3); lVar12 = lVar12 + 1) {
      pVVar3 = ppVVar5[lVar12];
      uVar1 = (pVVar3->m_type).m_numElements;
      access = rsg::ExecutionContext::getValue(execCtx,pVVar3);
      for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        pVVar4 = packets[iVar8 + (int)uVar11];
        CVar14 = rsg::ConstStridedValueAccess<64>::component
                           (&access.super_ConstStridedValueAccess<64>,0);
        *(Scalar *)(pVVar4->outputs + lVar12) = CVar14.m_value[uVar11];
        if (1 < (int)uVar1) {
          CVar14 = rsg::ConstStridedValueAccess<64>::component
                             (&access.super_ConstStridedValueAccess<64>,1);
          *(Scalar *)(pVVar4->outputs[lVar12].v.uData + 1) = CVar14.m_value[uVar11];
          if (uVar1 != 2) {
            CVar14 = rsg::ConstStridedValueAccess<64>::component
                               (&access.super_ConstStridedValueAccess<64>,2);
            *(Scalar *)(pVVar4->outputs[lVar12].v.uData + 2) = CVar14.m_value[uVar11];
            if (3 < uVar1) {
              CVar14 = rsg::ConstStridedValueAccess<64>::component
                                 (&access.super_ConstStridedValueAccess<64>,3);
              *(Scalar *)(pVVar4->outputs[lVar12].v.uData + 3) = CVar14.m_value[uVar11];
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void RandomShaderProgram::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	// \todo [2013-12-13 pyry] Do only when necessary.
	refreshUniforms();

	int packetOffset = 0;

	while (packetOffset < numPackets)
	{
		const int	numToExecute	= de::min(numPackets-packetOffset, (int)rsg::EXEC_VEC_WIDTH);

		// Fetch attributes.
		for (int attribNdx = 0; attribNdx < (int)m_vertexShader.getInputs().size(); ++attribNdx)
		{
			const rsg::Variable*		attribVar		= m_vertexShader.getInputs()[attribNdx]->getVariable();
			const rsg::VariableType&	attribType		= attribVar->getType();
			const int					numComponents	= attribType.getNumElements();
			rsg::ExecValueAccess		access			= m_execCtx.getValue(attribVar);

			DE_ASSERT(attribType.isFloatOrVec() && de::inRange(numComponents, 1, 4));

			for (int ndx = 0; ndx < numToExecute; ndx++)
			{
				const int				packetNdx	= ndx+packetOffset;
				const rr::VertexPacket*	packet		= packets[packetNdx];
				const tcu::Vec4			attribValue	= rr::readVertexAttribFloat(inputs[attribNdx], packet->instanceNdx, packet->vertexNdx);

										access.component(0).asFloat(ndx) = attribValue[0];
				if (numComponents >= 2)	access.component(1).asFloat(ndx) = attribValue[1];
				if (numComponents >= 3)	access.component(2).asFloat(ndx) = attribValue[2];
				if (numComponents >= 4)	access.component(3).asFloat(ndx) = attribValue[3];
			}
		}

		m_vertexShader.execute(m_execCtx);

		// Store position
		{
			const rsg::ExecConstValueAccess	access	= m_execCtx.getValue(m_positionVar);

			for (int ndx = 0; ndx < numToExecute; ndx++)
			{
				const int			packetNdx	= ndx+packetOffset;
				rr::VertexPacket*	packet		= packets[packetNdx];

				packet->position[0] = access.component(0).asFloat(ndx);
				packet->position[1] = access.component(1).asFloat(ndx);
				packet->position[2] = access.component(2).asFloat(ndx);
				packet->position[3] = access.component(3).asFloat(ndx);
			}
		}

		// Other varyings
		for (int varNdx = 0; varNdx < (int)m_vertexOutputs.size(); varNdx++)
		{
			const rsg::Variable*			var				= m_vertexOutputs[varNdx];
			const rsg::VariableType&		varType			= var->getType();
			const int						numComponents	= varType.getNumElements();
			const rsg::ExecConstValueAccess	access			= m_execCtx.getValue(var);

			DE_ASSERT(varType.isFloatOrVec() && de::inRange(numComponents, 1, 4));

			for (int ndx = 0; ndx < numToExecute; ndx++)
			{
				const int				packetNdx	= ndx+packetOffset;
				rr::VertexPacket* const	packet		= packets[packetNdx];
				float* const			dst			= packet->outputs[varNdx].getAccess<float>();

										dst[0] = access.component(0).asFloat(ndx);
				if (numComponents >= 2) dst[1] = access.component(1).asFloat(ndx);
				if (numComponents >= 3) dst[2] = access.component(2).asFloat(ndx);
				if (numComponents >= 4) dst[3] = access.component(3).asFloat(ndx);
			}
		}

		packetOffset += numToExecute;
	}
}